

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_runtimes.cpp
# Opt level: O0

size_t fibonacci_swapped(size_t N,Runtime *rt)

{
  Worker *pWVar1;
  size_t in_RSI;
  Runtime *in_RDI;
  size_t res2;
  size_t res1;
  Executor *local_28;
  Worker *in_stack_ffffffffffffffe0;
  Runtime *local_8;
  
  local_8 = in_RDI;
  if ((Runtime *)0x1 < in_RDI) {
    pWVar1 = (Worker *)fibonacci_swapped(in_RSI,(Runtime *)in_stack_ffffffffffffffe0);
    tf::Runtime::silent_async<fibonacci_swapped(unsigned_long,tf::Runtime&)::__0>
              ((Runtime *)&local_28,(anon_class_16_2_d707333b *)in_RDI);
    tf::Runtime::corun(in_RDI);
    local_8 = (Runtime *)(&pWVar1->_done + (long)&(local_28->_taskflows_mutex).super___mutex_base);
  }
  return (size_t)local_8;
}

Assistant:

size_t fibonacci_swapped(size_t N, tf::Runtime& rt) {

  if (N < 2) {
    return N; 
  }
  
  size_t res1, res2;
  
  // tail optimization
  res1 = fibonacci_swapped(N-1, rt);

  rt.silent_async([N, &res2](tf::Runtime& rt2){ res2 = fibonacci_swapped(N-2, rt2); });

  // use corun to avoid blocking the worker from waiting the two children tasks to finish
  rt.corun();

  return res1 + res2;
}